

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_comm.c
# Opt level: O1

void do_immtalk(CHAR_DATA *ch,char *argument)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  uint uVar6;
  char *pcVar7;
  CHAR_DATA *ch_00;
  basic_string_view<char> fmt;
  basic_string_view<char> fmt_00;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args_00;
  string buffer;
  char buf2 [4608];
  char arg1 [4608];
  long *local_26d8 [2];
  long local_26c8 [2];
  char *local_26b8 [2];
  char *local_26a8;
  buffer<char> local_2690;
  char local_2670 [504];
  char local_2478 [4608];
  char local_1278 [4680];
  
  bVar2 = is_immortal(ch);
  if (bVar2) {
    if (*argument == '\0') {
      if ((ch->comm[0] & 4) == 0) {
        send_to_char("Immortal channel is now OFF\n\r",ch);
        *(byte *)ch->comm = (byte)ch->comm[0] | 4;
      }
      else {
        send_to_char("Immortal channel is now ON\n\r",ch);
        *(byte *)ch->comm = (byte)ch->comm[0] & 0xfb;
      }
    }
    else {
      pcVar7 = local_2478;
      strcpy(pcVar7,argument);
      pcVar5 = one_argument(argument,local_1278);
      if (local_1278[0] != '\0') {
        bVar2 = is_number(local_1278);
        uVar6 = 0x33;
        if (bVar2) {
          uVar3 = atoi(local_1278);
          iVar4 = get_trust(ch);
          if ((0x32 < (int)uVar3) && ((int)uVar3 <= iVar4)) {
            strcpy(local_2478,pcVar5);
            uVar6 = uVar3;
          }
        }
        if (local_2478[0] != '\0') {
          if ((int)uVar6 < 0x34) {
            local_2690.ptr_ = local_2670;
            local_2690.size_ = 0;
            local_2690._vptr_buffer = (_func_int **)&PTR_grow_00457340;
            local_2690.capacity_ = 500;
            fmt_00.size_ = 4;
            fmt_00.data_ = ": {}";
            args_00.field_1.values_ =
                 (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_26b8;
            args_00.desc_ = 0xc;
            local_26b8[0] = pcVar7;
            ::fmt::v9::detail::vformat_to<char>(&local_2690,fmt_00,args_00,(locale_ref)0x0);
            local_26d8[0] = local_26c8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_26d8,local_2690.ptr_,local_2690.ptr_ + local_2690.size_);
          }
          else {
            local_26b8[0] = (char *)(ulong)uVar6;
            local_26a8 = local_2478;
            local_2690.ptr_ = local_2670;
            local_2690.size_ = 0;
            local_2690._vptr_buffer = (_func_int **)&PTR_grow_00457340;
            local_2690.capacity_ = 500;
            fmt.size_ = 9;
            fmt.data_ = " [{}]: {}";
            args.field_1.values_ =
                 (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_26b8;
            args.desc_ = 0xc1;
            ::fmt::v9::detail::vformat_to<char>(&local_2690,fmt,args,(locale_ref)0x0);
            local_26d8[0] = local_26c8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_26d8,local_2690.ptr_,local_2690.ptr_ + local_2690.size_);
          }
          if (local_2690.ptr_ != local_2670) {
            operator_delete(local_2690.ptr_,local_2690.capacity_);
          }
          uVar1 = ch->comm[0];
          ch->comm[0] = uVar1 & 0xfffffffffffffffb;
          if (((uint)uVar1 >> 10 & 1) == 0) {
            pcVar7 = "[IMM] $n$t";
          }
          else {
            pcVar5 = get_char_color(ch,"immtalk");
            END_COLOR(ch);
            sprintf(pcVar7,"%s[IMM] $n$t%s",pcVar5);
          }
          act_new(pcVar7,ch,local_26d8[0],(void *)0x0,3,0);
          if (char_list != (CHAR_DATA *)0x0) {
            uVar3 = 0x34;
            if (0x34 < (int)uVar6) {
              uVar3 = uVar6;
            }
            ch_00 = char_list;
            do {
              bVar2 = is_npc(ch_00);
              if ((((!bVar2) || (ch_00->desc != (DESCRIPTOR_DATA *)0x0)) &&
                  (((bVar2 = is_immortal(ch_00), bVar2 || ((ch_00->comm[0] & 0x40000) != 0)) ||
                   (((bVar2 = is_npc(ch_00), bVar2 && (ch_00->desc != (DESCRIPTOR_DATA *)0x0)) &&
                    (bVar2 = is_immortal(ch_00->desc->original), bVar2)))))) &&
                 (iVar4 = get_trust(ch_00), (int)uVar3 <= iVar4)) {
                pcVar7 = "[IMM] $n$t";
                if ((ch_00->comm[0] & 0x400) != 0) {
                  pcVar7 = get_char_color(ch_00,"immtalk");
                  pcVar5 = END_COLOR(ch_00);
                  sprintf(local_2478,"%s[IMM] $n$t%s",pcVar7,pcVar5);
                  pcVar7 = local_2478;
                }
                act_new(pcVar7,ch,local_26d8[0],ch_00,2,0);
              }
              ch_00 = ch_00->next;
            } while (ch_00 != (CHAR_DATA *)0x0);
          }
          if (local_26d8[0] == local_26c8) {
            return;
          }
          operator_delete(local_26d8[0],local_26c8[0] + 1);
          return;
        }
      }
      send_to_char("Syntax: immtalk <level?> <message>\n\r",ch);
    }
  }
  return;
}

Assistant:

void do_immtalk(CHAR_DATA *ch, char *argument)
{
	if (!is_immortal(ch))
		return;

	if (argument[0] == '\0')
	{
		if (IS_SET(ch->comm, COMM_NOWIZ))
		{
			send_to_char("Immortal channel is now ON\n\r", ch);
			REMOVE_BIT(ch->comm, COMM_NOWIZ);
		}
		else
		{
			send_to_char("Immortal channel is now OFF\n\r", ch);
			SET_BIT(ch->comm, COMM_NOWIZ);
		}

		return;
	}

	char buf2[MAX_STRING_LENGTH];
	sprintf(buf2, "%s", argument);

	char arg1[MAX_STRING_LENGTH];
	argument = one_argument(argument, arg1);

	if (arg1[0] == '\0')
	{
		send_to_char("Syntax: immtalk <level?> <message>\n\r", ch);
		return;
	}

	int level = 51;
	if (is_number(arg1))
	{
		level = atoi(arg1);
		if (level > get_trust(ch) || level < 51)
		{
			level = 51;
		}
		else
		{
			sprintf(buf2, "%s", argument);
		}
	}

	if (buf2[0] == '\0')
	{
		send_to_char("Syntax: immtalk <level?> <message>\n\r", ch);
		return;
	}

	auto buffer = level > LEVEL_HERO
		? fmt::format(" [{}]: {}", level, buf2)
		: fmt::format(": {}", buf2); //TODO: change the rest of the sprintf calls to format

	REMOVE_BIT(ch->comm, COMM_NOWIZ);

	if (IS_SET(ch->comm, COMM_ANSI))
	{
		sprintf(buf2, "%s[IMM] $n$t%s", get_char_color(ch, "immtalk"), END_COLOR(ch));
		act_new(buf2, ch, buffer.data(), 0, TO_CHAR, POS_DEAD);
	}
	else
	{
		act_new("[IMM] $n$t", ch, buffer.data(), 0, TO_CHAR, POS_DEAD);
	}

	for (auto wch = char_list; wch != nullptr; wch = wch->next)
	{
		if (is_npc(wch) && wch->desc == nullptr)
			continue;

		if ((is_immortal(wch) || IS_SET(wch->comm, COMM_IMMORTAL) || (is_npc(wch) && (wch->desc != nullptr) && is_immortal(wch->desc->original))) && get_trust(wch) >= std::max(level, 52))
		{
			if (IS_SET(wch->comm, COMM_ANSI))
			{
				sprintf(buf2, "%s[IMM] $n$t%s", get_char_color(wch, "immtalk"), END_COLOR(wch));
				act_new(buf2, ch, buffer.data(), wch, TO_VICT, POS_DEAD);
			}
			else
			{
				act_new("[IMM] $n$t", ch, buffer.data(), wch, TO_VICT, POS_DEAD);
			}
		}
	}
}